

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int ac,char **av)

{
  double dVar1;
  bool bVar2;
  char *pcVar3;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar4;
  typed_value<int,_char> *ptVar5;
  typed_value<double,_char> *ptVar6;
  size_type sVar7;
  void *pvVar8;
  ulong uVar9;
  ostream *poVar10;
  dataset_t *this;
  mscomplex_t *this_00;
  type this_01;
  type pmVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  shared_ptr<trimesh::dataset_t> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  shared_ptr<trimesh::dataset_t> local_470;
  shared_ptr<trimesh::mscomplex_t> local_460;
  undefined1 local_450 [8];
  mscomplex_ptr_t msc;
  dataset_ptr_t ds;
  string fn_pfx;
  fn_list_t fns;
  tri_idx_list_t tlist;
  timer t;
  required_option e;
  key_type local_318;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_2f8;
  basic_parsed_options<char> local_2d8;
  variables_map local_2b0 [8];
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_2a0 [151];
  allocator local_209;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  double local_1e8;
  int local_1e0;
  allocator local_1d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  allocator local_1b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  allocator local_189;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined8 local_168 [3];
  allocator local_149;
  string local_148 [32];
  options_description local_128 [8];
  options_description desc;
  double local_a8;
  double simp_tresh;
  undefined1 local_98 [4];
  int comp_no;
  string simp_method;
  string off_filename;
  string bin_filename;
  string tri_filename;
  char **av_local;
  int ac_local;
  
  av_local._4_4_ = 0;
  std::__cxx11::string::string((string *)(bin_filename.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(off_filename.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(simp_method.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_98);
  simp_tresh._4_4_ = 0;
  local_a8 = 0.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"Allowed options",&local_149);
  boost::program_options::options_description::options_description
            (local_128,local_148,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  local_168[0] = boost::program_options::options_description::add_options();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_168,"help,h");
  ptVar4 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&bin_filename.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_188,"",&local_189);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,&local_188);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"tri-file,t",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&off_filename.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b0,"",&local_1b1);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,&local_1b0);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"bin-file,b",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&simp_method.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,"",&local_1d9);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,&local_1d8);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"off-file,o",(char *)ptVar4);
  ptVar5 = boost::program_options::value<int>((int *)((long)&simp_tresh + 4));
  local_1e0 = 0;
  ptVar5 = boost::program_options::typed_value<int,_char>::default_value(ptVar5,&local_1e0);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"comp-no,c",(char *)ptVar5);
  ptVar6 = boost::program_options::value<double>(&local_a8);
  local_1e8 = 0.0;
  ptVar6 = boost::program_options::typed_value<double,_char>::default_value(ptVar6,&local_1e8);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"simp-tresh,s",(char *)ptVar6);
  ptVar4 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"P",&local_209);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,&local_208);
  boost::program_options::options_description_easy_init::operator()
            (pcVar3,(value_semantic *)"simp-method",(char *)ptVar4);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  boost::program_options::variables_map::variables_map(local_2b0);
  local_2f8.super_function_base.functor._8_8_ = 0;
  local_2f8.super_function_base.functor._16_8_ = 0;
  local_2f8.super_function_base.vtable = (vtable_base *)0x0;
  local_2f8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1(&local_2f8);
  boost::program_options::parse_command_line<char>(&local_2d8,ac,av,local_128,0,&local_2f8);
  boost::program_options::store((basic_parsed_options *)&local_2d8,local_2b0,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_2d8);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_2f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_318,"help",(allocator *)&e.field_0xb7);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_2a0,&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator((allocator<char> *)&e.field_0xb7);
  if (sVar7 == 0) {
    boost::program_options::notify(local_2b0);
    uVar9 = std::__cxx11::string::empty();
    if ((((uVar9 & 1) == 0) && (uVar9 = std::__cxx11::string::empty(), (uVar9 & 1) == 0)) ||
       (uVar9 = std::__cxx11::string::empty(), (uVar9 & 1) == 0)) {
      utl::timer::timer((timer *)&tlist.
                                  super__Vector_base<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      utl::timer::restart((timer *)&tlist.
                                    super__Vector_base<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar10 = std::operator<<((ostream *)&std::cout,"====================================");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      poVar10 = std::operator<<((ostream *)&std::cout,"         Starting Processing        ");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      poVar10 = std::operator<<((ostream *)&std::cout,"------------------------------------");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      std::
      vector<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
      ::vector((vector<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
                *)&fns.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)((long)&fn_pfx.field_2 + 8));
      poVar10 = std::operator<<((ostream *)&std::cout,"selected comp = ");
      pvVar8 = (void *)std::ostream::operator<<(poVar10,simp_tresh._4_4_);
      std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      poVar10 = std::operator<<((ostream *)&std::cout,"------------------------------------");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::string((string *)&ds.pn);
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        read_off_file<double>
                  ((string *)((long)&simp_method.field_2 + 8),
                   (vector<double,_std::allocator<double>_> *)((long)&fn_pfx.field_2 + 8),
                   (tri_idx_list_t *)
                   &fns.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,simp_tresh._4_4_);
        std::__cxx11::string::operator=
                  ((string *)&ds.pn,(string *)(simp_method.field_2._M_local_buf + 8));
      }
      else {
        print_bin_info((string *)((long)&off_filename.field_2 + 8));
        pcVar3 = (char *)std::__cxx11::string::c_str();
        read_tri_tlist(pcVar3,(tri_idx_list_t *)
                              &fns.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
        read_bin_file<double>
                  ((vector<double,_std::allocator<double>_> *)((long)&fn_pfx.field_2 + 8),
                   (string *)((long)&off_filename.field_2 + 8),simp_tresh._4_4_);
        std::__cxx11::string::operator=
                  ((string *)&ds.pn,(string *)(bin_filename.field_2._M_local_buf + 8));
      }
      poVar10 = std::operator<<((ostream *)&std::cout,"data read ---------------- ");
      dVar1 = utl::timer::elapsed((timer *)&tlist.
                                            super__Vector_base<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar8 = (void *)std::ostream::operator<<(poVar10,dVar1);
      std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      this = (dataset_t *)operator_new(0x60);
      trimesh::dataset_t::dataset_t
                (this,(fn_list_t *)((long)&fn_pfx.field_2 + 8),
                 (tri_idx_list_t *)
                 &fns.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      boost::shared_ptr<trimesh::dataset_t>::shared_ptr<trimesh::dataset_t>
                ((shared_ptr<trimesh::dataset_t> *)&msc.pn,this);
      this_00 = (mscomplex_t *)operator_new(400);
      trimesh::mscomplex_t::mscomplex_t(this_00);
      boost::shared_ptr<trimesh::mscomplex_t>::shared_ptr<trimesh::mscomplex_t>
                ((shared_ptr<trimesh::mscomplex_t> *)local_450,this_00);
      this_01 = boost::shared_ptr<trimesh::dataset_t>::operator->
                          ((shared_ptr<trimesh::dataset_t> *)&msc.pn);
      boost::shared_ptr<trimesh::mscomplex_t>::shared_ptr
                (&local_460,(shared_ptr<trimesh::mscomplex_t> *)local_450);
      trimesh::dataset_t::work(this_01,&local_460);
      boost::shared_ptr<trimesh::mscomplex_t>::~shared_ptr(&local_460);
      poVar10 = std::operator<<((ostream *)&std::cout,"gradient done ------------ ");
      dVar1 = utl::timer::elapsed((timer *)&tlist.
                                            super__Vector_base<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar8 = (void *)std::ostream::operator<<(poVar10,dVar1);
      std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      pmVar11 = boost::shared_ptr<trimesh::mscomplex_t>::operator->
                          ((shared_ptr<trimesh::mscomplex_t> *)local_450);
      trimesh::mscomplex_t::simplify(pmVar11,0.0,false,0,0);
      pmVar11 = boost::shared_ptr<trimesh::mscomplex_t>::operator->
                          ((shared_ptr<trimesh::mscomplex_t> *)local_450);
      boost::shared_ptr<trimesh::dataset_t>::shared_ptr
                (&local_470,(shared_ptr<trimesh::dataset_t> *)&msc.pn);
      trimesh::mscomplex_t::collect_mfolds(pmVar11,&local_470);
      boost::shared_ptr<trimesh::dataset_t>::~shared_ptr(&local_470);
      pmVar11 = boost::shared_ptr<trimesh::mscomplex_t>::operator->
                          ((shared_ptr<trimesh::mscomplex_t> *)local_450);
      std::operator+(&local_490,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ds.pn,
                     ".mscomplex.full.bin");
      trimesh::mscomplex_t::save(pmVar11,&local_490);
      std::__cxx11::string::~string((string *)&local_490);
      poVar10 = std::operator<<((ostream *)&std::cout,"write unsimplified done -- ");
      dVar1 = utl::timer::elapsed((timer *)&tlist.
                                            super__Vector_base<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar8 = (void *)std::ostream::operator<<(poVar10,dVar1);
      std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_98,"P");
      if (bVar2) {
        pmVar11 = boost::shared_ptr<trimesh::mscomplex_t>::operator->
                            ((shared_ptr<trimesh::mscomplex_t> *)local_450);
        trimesh::mscomplex_t::simplify(pmVar11,local_a8,false,0,0);
      }
      poVar10 = std::operator<<((ostream *)&std::cout,"simplification done ------ ");
      dVar1 = utl::timer::elapsed((timer *)&tlist.
                                            super__Vector_base<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar8 = (void *)std::ostream::operator<<(poVar10,dVar1);
      std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      pmVar11 = boost::shared_ptr<trimesh::mscomplex_t>::operator->
                          ((shared_ptr<trimesh::mscomplex_t> *)local_450);
      boost::shared_ptr<trimesh::dataset_t>::shared_ptr
                (&local_4a0,(shared_ptr<trimesh::dataset_t> *)&msc.pn);
      trimesh::mscomplex_t::collect_mfolds(pmVar11,&local_4a0);
      boost::shared_ptr<trimesh::dataset_t>::~shared_ptr(&local_4a0);
      pmVar11 = boost::shared_ptr<trimesh::mscomplex_t>::operator->
                          ((shared_ptr<trimesh::mscomplex_t> *)local_450);
      std::operator+(&local_4c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ds.pn,
                     ".mscomplex.bin");
      trimesh::mscomplex_t::save(pmVar11,&local_4c0);
      std::__cxx11::string::~string((string *)&local_4c0);
      poVar10 = std::operator<<((ostream *)&std::cout,"write simplified done ---- ");
      dVar1 = utl::timer::elapsed((timer *)&tlist.
                                            super__Vector_base<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar8 = (void *)std::ostream::operator<<(poVar10,dVar1);
      std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      poVar10 = std::operator<<((ostream *)&std::cout,"------------------------------------");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      poVar10 = std::operator<<((ostream *)&std::cout,"        Finished Processing         ");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      poVar10 = std::operator<<((ostream *)&std::cout,"====================================");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      boost::shared_ptr<trimesh::mscomplex_t>::~shared_ptr
                ((shared_ptr<trimesh::mscomplex_t> *)local_450);
      boost::shared_ptr<trimesh::dataset_t>::~shared_ptr((shared_ptr<trimesh::dataset_t> *)&msc.pn);
      std::__cxx11::string::~string((string *)&ds.pn);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)((long)&fn_pfx.field_2 + 8));
      std::
      vector<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
      ::~vector((vector<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
                 *)&fns.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      e._176_4_ = 0;
    }
    else {
      poVar10 = std::operator<<((ostream *)&std::cout,"Must specify either tri-bin or off file");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      pvVar8 = (void *)boost::program_options::operator<<((ostream *)&std::cout,local_128);
      std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      av_local._4_4_ = 1;
      e._176_4_ = 1;
    }
  }
  else {
    pvVar8 = (void *)boost::program_options::operator<<((ostream *)&std::cout,local_128);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    av_local._4_4_ = 0;
    e._176_4_ = 1;
  }
  boost::program_options::variables_map::~variables_map(local_2b0);
  boost::program_options::options_description::~options_description(local_128);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)(simp_method.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(off_filename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(bin_filename.field_2._M_local_buf + 8));
  return av_local._4_4_;
}

Assistant:

int main(int ac , char **av)
{
  string tri_filename;
  string bin_filename;
  string off_filename;
  string simp_method;

  int    comp_no = 0;
  double simp_tresh  = 0.0;

  bpo::options_description desc("Allowed options");
  desc.add_options()
      ("help,h", "produce help message")
      ("tri-file,t",bpo::value(&tri_filename)->default_value(""),
       "tri file name")
      ("bin-file,b",bpo::value(&bin_filename)->default_value(""),
       "bin file name (function file)")
      ("off-file,o",bpo::value(&off_filename)->default_value(""),
       "off file name")
      ("comp-no,c",bpo::value(&comp_no)->default_value(0),
       "scalar component number to use for the MS compelex")
      ("simp-tresh,s",bpo::value(&simp_tresh)->default_value(0.0),
       "simplification treshold\n"\
       "\n"\
       "====For simp-method = \"P\"=========\n"\
       "if s in [0,1] then simplify all features having pers < s\n"\
       "if s < 0 then simplify till there are int(-s) minima\n"\
       "if s > 1 then simplify till there are int(s)  maxima\n"\
       "\n")
      ("simp-method",bpo::value(&simp_method)->default_value("P"),
       "simplification method to use\n"\
       "P  ----> Persistence\n"\
//       "AWP ---> Area weighted persistence\n"\
//       "ABP ---> Area before persistence"
       );

  bpo::variables_map vm;
  bpo::store(bpo::parse_command_line(ac, av, desc), vm);

  if (vm.count("help"))
  {
    cout << desc << endl;
    return 0;
  }
  try
  {
    bpo::notify(vm);
  }
  catch(bpo::required_option e)
  {
    cout<<e.what()<<endl;
    cout<<desc<<endl;
    return 1;
  }

  if((tri_filename.empty() || bin_filename.empty()) && off_filename.empty())
  {
    cout<<"Must specify either tri-bin or off file"<<endl;
    cout<<desc<<endl;
    return 1;
  }

  utl::timer t;
  t.restart();

  cout<<"===================================="<<endl;
  cout<<"         Starting Processing        "<<endl;
  cout<<"------------------------------------"<<endl;

  trimesh::tri_idx_list_t tlist;
  trimesh::fn_list_t      fns;
  cout<<"selected comp = "<<comp_no<<endl;
  cout<<"------------------------------------"<<endl;

  string fn_pfx;

  if(off_filename.empty())
  {
    print_bin_info(bin_filename);
    read_tri_tlist(tri_filename.c_str(),tlist);
    read_bin_file(fns,bin_filename,comp_no);
    fn_pfx = tri_filename;
  }
  else
  {
    read_off_file(off_filename,fns,tlist,comp_no);
    fn_pfx = off_filename;
  }
  cout<<"data read ---------------- "<<t.elapsed()<<endl;

  trimesh::dataset_ptr_t   ds(new trimesh::dataset_t(fns,tlist));
  trimesh::mscomplex_ptr_t msc(new trimesh::mscomplex_t);
  ds->work(msc);
  cout<<"gradient done ------------ "<<t.elapsed()<<endl;

  msc->simplify(0.0);
  msc->collect_mfolds(ds);

  msc->save(fn_pfx+".mscomplex.full.bin");
  cout<<"write unsimplified done -- "<<t.elapsed()<<endl;


  if( simp_method == "P")
  {
    msc->simplify(simp_tresh);
  }
//  else if (simp_method == "AWP" || simp_method == "ABP")
//  {
//    tri_cc_geom_t::vertex_list_t vlist;

//    if(off_filename.empty())
//      read_tri_vlist(tri_filename.c_str(),vlist);
//    else
//      read_off_vlist(off_filename.c_str(),vlist);

//    tri_cc_geom_ptr_t tcc(new tri_cc_geom_t);
//    tcc->init(ds->m_tcc,vlist);

//    if(simp_method == "AWP")
//      trimesh::simplify_awp(msc,tcc,simp_tresh);
//    else if(simp_method == "ABP")
//      trimesh::simplify_abp(msc,tcc,simp_tresh);

//  }

  cout<<"simplification done ------ "<<t.elapsed()<<endl;

  msc->collect_mfolds(ds);
  msc->save(fn_pfx+".mscomplex.bin");
  cout<<"write simplified done ---- "<<t.elapsed()<<endl;

  cout<<"------------------------------------"<<endl;
  cout<<"        Finished Processing         "<<endl;
  cout<<"===================================="<<endl;
}